

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

bool CLI::detail::valid_name_string(string *str)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  reference pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  c;
  const_iterator e;
  string *str_local;
  
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
    bVar1 = valid_first_char<char>(*pcVar3);
    if (bVar1) {
      c._M_current = (char *)::std::__cxx11::string::end();
      local_30._M_current = (char *)::std::__cxx11::string::begin();
      local_28 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_30,1);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&local_28,&c);
        if (!bVar1) {
          return true;
        }
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_28);
        bVar1 = valid_later_char<char>(*pcVar4);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_28);
      }
      return false;
    }
  }
  return false;
}

Assistant:

CLI11_INLINE bool valid_name_string(const std::string &str) {
    if(str.empty() || !valid_first_char(str[0])) {
        return false;
    }
    auto e = str.end();
    for(auto c = str.begin() + 1; c != e; ++c)
        if(!valid_later_char(*c))
            return false;
    return true;
}